

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O2

void __thiscall OpenMD::Sticky::calcForce(Sticky *this,InteractionData *idat)

{
  Vector3d *v;
  RealType *t;
  char cVar1;
  pointer piVar2;
  long lVar3;
  InteractionData *pIVar4;
  RectMatrix<double,_3U,_3U> *m;
  long lVar5;
  RealType RVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  RealType sp;
  RealType s;
  Vector3d radcomi;
  RealType dspdr;
  Vector3d tj;
  RealType dsdr;
  Vector3d fjj;
  Vector3d fii;
  Vector3d ti;
  Vector3d radcomj;
  Vector3d rj;
  Vector3d ri;
  RotMat3x3d A2trans;
  RotMat3x3d A1trans;
  RealType local_4f8;
  double local_4f0;
  undefined1 local_4e8 [24];
  RealType local_4d0;
  double local_4c8;
  Vector<double,_3U> local_4c0;
  double local_4a8;
  double dStack_4a0;
  RealType local_490;
  RealType local_488;
  double dStack_480;
  double local_478;
  double dStack_470;
  double local_468;
  double dStack_460;
  undefined1 local_458 [16];
  Vector<double,_3U> local_448;
  RealType local_430;
  double local_428;
  double dStack_420;
  double local_418;
  double dStack_410;
  Vector<double,_3U> local_400;
  Vector<double,_3U> local_3e8;
  Vector<double,_3U> local_3d0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  double dStack_390;
  undefined4 local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  Vector<double,_3U> local_378;
  Vector<double,_3U> local_360;
  double local_348;
  double dStack_340;
  double local_338;
  double dStack_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  undefined1 local_2d8 [16];
  double local_2c8;
  InteractionData *local_2c0;
  Vector<double,_3U> local_2b8;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  undefined1 local_268 [16];
  double local_258;
  Vector<double,_3U> local_250;
  RectMatrix<double,_3U,_3U> local_238;
  double local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  double local_1b8;
  undefined1 local_1a8 [16];
  double local_198;
  undefined1 local_188 [16];
  double local_178;
  undefined1 local_168 [16];
  double local_158;
  Vector<double,_3U> local_148;
  Vector<double,_3U> local_128;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  RectMatrix<double,_3U,_3U> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_4e8._8_8_ = local_4e8._0_8_;
  if (this->initialized_ == false) {
    initialize(this);
  }
  piVar2 = (this->Stids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = *(long *)&(this->MixingMap).
                    super__Vector_base<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[piVar2[idat->atid1]].
                    super__Vector_base<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  lVar5 = (long)piVar2[idat->atid2] * 0x58;
  dVar25 = idat->rij;
  if (dVar25 <= *(double *)(lVar3 + 0x20 + lVar5)) {
    local_1e8 = *(double *)(lVar3 + 0x28 + lVar5);
    uStack_1e0 = 0;
    local_4c8 = *(double *)(lVar3 + 0x30 + lVar5);
    local_4f0 = *(double *)(lVar3 + 0x38 + lVar5);
    local_418 = *(double *)(lVar3 + lVar5);
    local_4e8._0_8_ = *(undefined8 *)(lVar3 + 8 + lVar5);
    local_428 = *(double *)(lVar3 + 0x10 + lVar5);
    local_478 = *(double *)(lVar3 + 0x18 + lVar5);
    cVar1 = *(char *)(lVar3 + 0x50 + lVar5);
    local_488 = idat->r2;
    dStack_480 = 0.0;
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_78,&idat->A1);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)&local_c0,&idat->A2);
    v = &idat->d;
    local_2c0 = idat;
    operator*((Vector<double,_3U> *)&local_238,(RectMatrix<double,_3U,_3U> *)&idat->A1,
              &v->super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&local_128,(Vector<double,_3U> *)&local_238);
    operator-(&local_238,(OpenMD *)&idat->A2,m);
    operator*(&local_2b8,&local_238,&v->super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&local_148,&local_2b8);
    pIVar4 = local_2c0;
    t = &local_2c0->rij;
    local_4d0 = 0.0;
    local_430 = 0.0;
    local_4f8 = 0.0;
    local_490 = 0.0;
    RVar6 = *t;
    local_4a8 = local_128.data_[0];
    dStack_4a0 = local_128.data_[1];
    local_338 = local_148.data_[2];
    dStack_330 = 0.0;
    local_388 = local_148.data_[0]._0_4_;
    uStack_384 = local_148.data_[0]._4_4_;
    uStack_380 = local_148.data_[1]._0_4_;
    uStack_37c = local_148.data_[1]._4_4_;
    local_348 = local_128.data_[2];
    dStack_340 = 0.0;
    if (RVar6 < (double)local_4e8._0_8_) {
      if (local_418 <= RVar6) {
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar3 + lVar5 + 0x40),t,&local_4d0,&local_430);
        RVar6 = *t;
      }
      else {
        local_4d0 = 1.0;
        local_430 = 0.0;
      }
    }
    if (RVar6 < local_478) {
      if (local_428 <= RVar6) {
        CubicSpline::getValueAndDerivativeAt
                  (*(CubicSpline **)(lVar3 + lVar5 + 0x48),t,&local_4f8,&local_490);
        RVar6 = *t;
      }
      else {
        local_4f8 = 1.0;
        local_490 = 0.0;
      }
    }
    dVar25 = dVar25 * local_488;
    local_488 = local_488 * dVar25;
    local_278 = local_348 * local_348;
    dStack_420 = (double)CONCAT44(uStack_37c,uStack_380);
    local_478 = (double)CONCAT44(uStack_37c,uStack_380);
    dStack_470 = (double)CONCAT44(uStack_37c,uStack_380);
    local_2e8 = local_338 * local_338;
    local_2f8 = local_4a8 * local_4a8 - dStack_4a0 * dStack_4a0;
    local_398 = (local_348 * (local_2f8 + local_2f8)) / dVar25;
    local_428 = (double)CONCAT44(uStack_384,local_388) * (double)CONCAT44(uStack_384,local_388) -
                (double)CONCAT44(uStack_37c,uStack_380) * local_478;
    local_458._0_8_ = local_428 + local_428;
    auVar22._8_8_ = local_338;
    auVar22._0_8_ = local_348;
    auVar20._8_8_ = RVar6;
    auVar20._0_8_ = RVar6;
    auVar23 = divpd(auVar22,auVar20);
    local_3b8 = auVar23._0_8_ + -0.6;
    dStack_3b0 = auVar23._8_8_ + -0.6;
    local_288 = auVar23._0_8_ + 0.8;
    dStack_280 = auVar23._8_8_ + 0.8;
    local_308 = (local_338 * (double)local_458._0_8_) / dVar25;
    local_298 = local_3b8 * local_3b8;
    dStack_290 = dStack_3b0 * dStack_3b0;
    local_468 = 4.0;
    dStack_460 = -4.0;
    local_318._8_8_ = dStack_4a0;
    local_318._0_8_ = (local_2f8 + local_2f8) / dVar25 - (local_278 * 6.0 * local_2f8) / local_488;
    local_4e8._0_8_ = local_4a8 * 4.0;
    local_4e8._8_8_ = dStack_4a0 * -4.0;
    local_3a8 = 6.0;
    dStack_3a0 = 6.0;
    local_328._0_8_ = local_4a8 * 6.0;
    local_328._8_8_ = dStack_4a0 * 6.0;
    local_418 = dStack_4a0;
    dStack_410 = dStack_4a0;
    dStack_390 = dStack_340;
    dStack_300 = dStack_330;
    dStack_2f0 = dStack_4a0;
    dStack_2e0 = dStack_330;
    dStack_270 = dStack_340;
    local_458._8_8_ = dStack_420;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)&local_238);
    local_1d8._8_4_ = SUB84(local_348,0);
    local_1d8._0_8_ = local_348;
    local_1d8._12_4_ = (int)((ulong)local_348 >> 0x20);
    auVar19._0_8_ = (double)local_4e8._0_8_ * local_348;
    auVar19._8_8_ = (double)local_4e8._8_8_ * local_348;
    local_4e8._8_8_ = dVar25;
    local_4e8._0_8_ = dVar25;
    auVar20 = divpd(auVar19,local_4e8._0_16_);
    dStack_2f0 = local_2f8;
    auVar24._0_8_ = (double)local_328._0_8_ * local_348 * local_2f8;
    auVar24._8_8_ = (double)local_328._8_8_ * local_348 * local_2f8;
    uVar17 = (undefined4)((ulong)local_488 >> 0x20);
    local_328._8_4_ = SUB84(local_488,0);
    local_328._0_8_ = local_488;
    local_328._12_4_ = uVar17;
    auVar23._8_4_ = SUB84(local_488,0);
    auVar23._0_8_ = local_488;
    auVar23._12_4_ = uVar17;
    auVar23 = divpd(auVar24,auVar23);
    local_238.data_[0][0] = auVar20._0_8_ - auVar23._0_8_;
    local_238.data_[0][1] = auVar20._8_8_ - auVar23._8_8_;
    local_238.data_[0][2] = (double)local_318._0_8_;
    local_458._0_8_ = (double)local_458._0_8_ / dVar25 - (local_2e8 * 6.0 * local_428) / local_488;
    local_468 = local_468 * (double)CONCAT44(uStack_384,local_388);
    dStack_460 = dStack_460 * (double)CONCAT44(uStack_37c,uStack_380);
    local_3a8 = local_3a8 * (double)CONCAT44(uStack_384,local_388);
    dStack_3a0 = dStack_3a0 * (double)CONCAT44(uStack_37c,uStack_380);
    Vector<double,_3U>::Vector(&local_2b8);
    local_318._8_4_ = SUB84(local_338,0);
    local_318._0_8_ = local_338;
    local_318._12_4_ = (int)((ulong)local_338 >> 0x20);
    auVar7._0_8_ = local_468 * local_338;
    auVar7._8_8_ = dStack_460 * local_338;
    auVar23 = divpd(auVar7,local_4e8._0_16_);
    dStack_420 = local_428;
    auVar21._0_8_ = local_3a8 * local_338 * local_428;
    auVar21._8_8_ = dStack_3a0 * local_338 * local_428;
    auVar20 = divpd(auVar21,local_328);
    local_2b8.data_[0] = auVar23._0_8_ - auVar20._0_8_;
    local_2b8.data_[1] = auVar23._8_8_ - auVar20._8_8_;
    local_2b8.data_[2] = (double)local_458._0_8_;
    local_468 = local_298 * local_288 + local_3b8 * local_288 * local_288;
    local_458._8_4_ = SUB84(dStack_290,0);
    local_458._0_8_ = local_468;
    local_458._12_4_ = (int)((ulong)dStack_290 >> 0x20);
    local_488 = dStack_290 * dStack_280 + dStack_3b0 * dStack_280 * dStack_280;
    dStack_480 = dStack_290;
    dVar11 = 1.0 / *t - local_278 / dVar25;
    local_468 = (dVar11 + dVar11) * local_468;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_168);
    local_3a8 = local_4a8 * -2.0;
    dStack_3a0 = dStack_4a0 * -2.0;
    local_458._8_8_ = local_458._0_8_;
    auVar12._0_8_ = (double)local_1d8._0_8_ * local_3a8 * (double)local_458._0_8_;
    auVar12._8_8_ = (double)local_1d8._8_8_ * dStack_3a0 * (double)local_458._0_8_;
    local_168 = divpd(auVar12,local_4e8._0_16_);
    local_158 = local_468;
    dVar11 = 1.0 / *t - local_2e8 / dVar25;
    local_3b8 = (dVar11 + dVar11) * local_488;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_188);
    local_468 = (double)CONCAT44(uStack_384,local_388) * -2.0;
    dStack_460 = (double)CONCAT44(uStack_37c,uStack_380) * -2.0;
    dStack_480 = local_488;
    auVar13._0_8_ = (double)local_318._0_8_ * local_468 * local_488;
    auVar13._8_8_ = (double)local_318._8_8_ * dStack_460 * local_488;
    local_188 = divpd(auVar13,local_4e8._0_16_);
    local_178 = local_3b8;
    local_3b8 = dStack_4a0;
    dStack_3b0 = local_4a8;
    local_4a8 = (local_4a8 * -8.0 * local_418 * local_348) / dVar25;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_2d8);
    auVar14._0_8_ = (local_278 * local_3b8 + local_3b8 * 0.5 * local_2f8) * 4.0;
    auVar14._8_8_ = (local_278 * dStack_3b0 + dStack_3b0 * -0.5 * dStack_2f0) * 4.0;
    local_2d8 = divpd(auVar14,local_4e8._0_16_);
    local_2c8 = local_4a8;
    dStack_4a0 = (double)CONCAT44(uStack_384,local_388);
    local_4a8 = (double)CONCAT44(uStack_37c,uStack_380);
    dVar11 = dStack_4a0 * -8.0 * local_478 * local_338;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_268);
    auVar8._0_8_ = (local_2e8 * local_4a8 + local_4a8 * 0.5 * local_428) * 4.0;
    auVar8._8_8_ = (local_2e8 * dStack_4a0 + dStack_4a0 * -0.5 * dStack_420) * 4.0;
    local_268 = divpd(auVar8,local_4e8._0_16_);
    local_418 = local_418 + local_418;
    RVar6 = *t;
    local_258 = dVar11 / dVar25;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_1a8);
    auVar9._0_8_ = local_418 * (double)local_458._0_8_;
    auVar9._8_8_ = local_3a8 * (double)local_458._8_8_;
    auVar15._8_8_ = RVar6;
    auVar15._0_8_ = RVar6;
    local_1a8 = divpd(auVar9,auVar15);
    local_198 = 0.0;
    local_478 = local_478 + local_478;
    RVar6 = *t;
    Vector<double,_3U>::Vector((Vector<double,_3U> *)local_1c8);
    auVar10._0_8_ = local_478 * local_488;
    auVar10._8_8_ = local_468 * dStack_480;
    auVar16._8_8_ = RVar6;
    auVar16._0_8_ = RVar6;
    local_1c8 = divpd(auVar10,auVar16);
    local_1b8 = 0.0;
    if (cVar1 == '\0') {
      local_4e8._8_8_ = dStack_290 * dStack_280 * dStack_280 - local_1e8;
      local_4e8._0_8_ = (double)local_4e8._8_8_ + (local_298 * local_288 * local_288 - local_1e8);
      local_398 = local_398 + local_308;
      uVar17 = SUB84(local_4f0,0);
      uVar18 = (undefined4)((ulong)local_4f0 >> 0x20);
    }
    else {
      std::operator<<((ostream *)&std::cerr,"This is probably an error!\n");
      local_4a8 = local_398 * local_398;
      dStack_4a0 = dStack_390;
      dVar25 = local_4a8 * 0.75;
      operator*(&local_448,dVar25,(Vector<double,_3U> *)&local_238);
      operator*(&local_4c0,0.75,(Vector<double,_3U> *)&local_238);
      OpenMD::operator+(&local_3d0,&local_448,&local_4c0);
      Vector3<double>::operator=((Vector3<double> *)&local_238,&local_3d0);
      local_478 = local_308 * local_308;
      dStack_470 = dStack_300;
      local_4e8._0_8_ = local_478 * 0.75;
      operator*(&local_448,local_478 * 0.75,(Vector<double,_3U> *)&local_238);
      operator*(&local_4c0,0.75,(Vector<double,_3U> *)&local_238);
      OpenMD::operator+(&local_3d0,&local_448,&local_4c0);
      Vector3<double>::operator=((Vector3<double> *)&local_2b8,&local_3d0);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)local_168,(Vector<double,_3U> *)OpenMD::V3Zero);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)local_188,(Vector<double,_3U> *)OpenMD::V3Zero);
      operator*(&local_448,dVar25,(Vector<double,_3U> *)local_2d8);
      operator*(&local_4c0,0.75,(Vector<double,_3U> *)local_2d8);
      OpenMD::operator+(&local_3d0,&local_448,&local_4c0);
      Vector3<double>::operator=((Vector3<double> *)local_2d8,&local_3d0);
      operator*(&local_448,(double)local_4e8._0_8_,(Vector<double,_3U> *)local_268);
      operator*(&local_4c0,0.75,(Vector<double,_3U> *)local_268);
      OpenMD::operator+(&local_3d0,&local_448,&local_4c0);
      Vector3<double>::operator=((Vector3<double> *)local_2d8,&local_3d0);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)local_1a8,(Vector<double,_3U> *)OpenMD::V3Zero);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)local_1c8,(Vector<double,_3U> *)OpenMD::V3Zero);
      local_4f8 = 0.0;
      local_490 = 0.0;
      uVar17 = SUB84(local_4f0,0);
      uVar18 = (undefined4)((ulong)local_4f0 >> 0x20);
      local_398 = local_308 * 0.75 +
                  local_308 * 0.25 * local_478 + local_398 * 0.25 * local_4a8 + local_398 * 0.75 +
                  local_4f0;
      local_4e8._0_8_ = 0.0;
      local_4e8._8_8_ = 0.0;
      dStack_390 = dStack_300;
    }
    dVar11 = (local_4d0 * local_4c8 * local_398 +
             local_4f8 * (double)CONCAT44(uVar18,uVar17) * (double)local_4e8._0_8_) * 0.5;
    pIVar4->vpair = pIVar4->vpair + dVar11;
    dVar25 = pIVar4->sw;
    dVar11 = dVar11 * dVar25;
    (pIVar4->pot).data_[5] = (pIVar4->pot).data_[5] + dVar11;
    if (pIVar4->isSelected == true) {
      (pIVar4->selePot).data_[5] = dVar11 + (pIVar4->selePot).data_[5];
    }
    operator*(&local_360,local_4d0 * local_4c8,(Vector<double,_3U> *)local_2d8);
    operator*(&local_3e8,local_4f8 * local_4f0,(Vector<double,_3U> *)local_1a8);
    OpenMD::operator+(&local_4c0,&local_360,&local_3e8);
    operator*(&local_448,dVar25 * 0.5,&local_4c0);
    Vector<double,_3U>::Vector(&local_3d0,&local_448);
    dVar25 = pIVar4->sw;
    operator*(&local_3e8,local_4d0 * local_4c8,(Vector<double,_3U> *)local_268);
    operator*(&local_400,local_4f8 * local_4f0,(Vector<double,_3U> *)local_1c8);
    OpenMD::operator+(&local_360,&local_3e8,&local_400);
    operator*(&local_4c0,dVar25 * 0.5,&local_360);
    Vector<double,_3U>::Vector(&local_448,&local_4c0);
    operator*(&local_4c0,&local_78,&local_3d0);
    Vector<double,_3U>::add(&(pIVar4->t1).super_Vector<double,_3U>,&local_4c0);
    operator*(&local_4c0,&local_c0,&local_448);
    Vector<double,_3U>::add(&(pIVar4->t2).super_Vector<double,_3U>,&local_4c0);
    operator*(&local_400,local_4d0 * local_4c8,(Vector<double,_3U> *)&local_238);
    operator*(&local_378,local_4f8 * local_4f0,(Vector<double,_3U> *)local_168);
    OpenMD::operator+(&local_3e8,&local_400,&local_378);
    operator*(&local_360,&local_3e8,pIVar4->sw);
    Vector<double,_3U>::Vector(&local_4c0,&local_360);
    operator*(&local_378,local_4d0 * local_4c8,&local_2b8);
    operator*(&local_250,local_4f8 * local_4f0,(Vector<double,_3U> *)local_188);
    OpenMD::operator+(&local_400,&local_378,&local_250);
    operator*(&local_3e8,&local_400,pIVar4->sw);
    Vector<double,_3U>::Vector(&local_360,&local_3e8);
    operator*(&local_400,&local_78,&local_4c0);
    Vector<double,_3U>::Vector(&local_3e8,&local_400);
    operator*(&local_378,&local_c0,&local_360);
    Vector<double,_3U>::Vector(&local_400,&local_378);
    operator*(&local_108,
              local_4c8 * local_430 * local_398 + (double)local_4e8._0_8_ * local_4f0 * local_490,
              &v->super_Vector<double,_3U>);
    operator/(&local_f0,&local_108,*t);
    OpenMD::operator+(&local_d8,&local_f0,&local_3e8);
    operator-(&local_250,&local_d8,&local_400);
    operator*(&local_378,0.5,&local_250);
    Vector<double,_3U>::add(&(pIVar4->f1).super_Vector<double,_3U>,&local_378);
  }
  return;
}

Assistant:

void Sticky::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    StickyInteractionData& mixer =
        MixingMap[Stids[idat.atid1]][Stids[idat.atid2]];

    RealType w0   = mixer.w0;
    RealType v0   = mixer.v0;
    RealType v0p  = mixer.v0p;
    RealType rl   = mixer.rl;
    RealType ru   = mixer.ru;
    RealType rlp  = mixer.rlp;
    RealType rup  = mixer.rup;
    RealType rbig = mixer.rbig;
    bool isPower  = mixer.isPower;

    if (idat.rij <= rbig) {
      RealType r3 = idat.r2 * idat.rij;
      RealType r5 = r3 * idat.r2;

      RotMat3x3d A1trans = idat.A1.transpose();
      RotMat3x3d A2trans = idat.A2.transpose();

      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:

      Vector3d ri = idat.A1 * idat.d;

      // negative sign because this is the vector from j to i:

      Vector3d rj = -idat.A2 * idat.d;

      RealType xi = ri.x();
      RealType yi = ri.y();
      RealType zi = ri.z();

      RealType xj = rj.x();
      RealType yj = rj.y();
      RealType zj = rj.z();

      RealType xi2 = xi * xi;
      RealType yi2 = yi * yi;
      RealType zi2 = zi * zi;

      RealType xj2 = xj * xj;
      RealType yj2 = yj * yj;
      RealType zj2 = zj * zj;

      // calculate the switching info. from the splines

      RealType s     = 0.0;
      RealType dsdr  = 0.0;
      RealType sp    = 0.0;
      RealType dspdr = 0.0;

      if (idat.rij < ru) {
        if (idat.rij < rl) {
          s    = 1.0;
          dsdr = 0.0;
        } else {
          // we are in the switching region
          mixer.s->getValueAndDerivativeAt(idat.rij, s, dsdr);
        }
      }

      if (idat.rij < rup) {
        if (idat.rij < rlp) {
          sp    = 1.0;
          dspdr = 0.0;
        } else {
          // we are in the switching region
          mixer.sp->getValueAndDerivativeAt(idat.rij, sp, dspdr);
        }
      }

      RealType wi = 2.0 * (xi2 - yi2) * zi / r3;
      RealType wj = 2.0 * (xj2 - yj2) * zj / r3;
      RealType w  = wi + wj;

      RealType zif = zi / idat.rij - 0.6;
      RealType zis = zi / idat.rij + 0.8;

      RealType zjf = zj / idat.rij - 0.6;
      RealType zjs = zj / idat.rij + 0.8;

      RealType wip = zif * zif * zis * zis - w0;
      RealType wjp = zjf * zjf * zjs * zjs - w0;
      RealType wp  = wip + wjp;

      Vector3d dwi(4.0 * xi * zi / r3 - 6.0 * xi * zi * (xi2 - yi2) / r5,
                   -4.0 * yi * zi / r3 - 6.0 * yi * zi * (xi2 - yi2) / r5,
                   2.0 * (xi2 - yi2) / r3 - 6.0 * zi2 * (xi2 - yi2) / r5);

      Vector3d dwj(4.0 * xj * zj / r3 - 6.0 * xj * zj * (xj2 - yj2) / r5,
                   -4.0 * yj * zj / r3 - 6.0 * yj * zj * (xj2 - yj2) / r5,
                   2.0 * (xj2 - yj2) / r3 - 6.0 * zj2 * (xj2 - yj2) / r5);

      RealType uglyi = zif * zif * zis + zif * zis * zis;
      RealType uglyj = zjf * zjf * zjs + zjf * zjs * zjs;

      Vector3d dwip(-2.0 * xi * zi * uglyi / r3, -2.0 * yi * zi * uglyi / r3,
                    2.0 * (1.0 / idat.rij - zi2 / r3) * uglyi);

      Vector3d dwjp(-2.0 * xj * zj * uglyj / r3, -2.0 * yj * zj * uglyj / r3,
                    2.0 * (1.0 / idat.rij - zj2 / r3) * uglyj);

      Vector3d dwidu(4.0 * (yi * zi2 + 0.5 * yi * (xi2 - yi2)) / r3,
                     4.0 * (xi * zi2 - 0.5 * xi * (xi2 - yi2)) / r3,
                     -8.0 * xi * yi * zi / r3);

      Vector3d dwjdu(4.0 * (yj * zj2 + 0.5 * yj * (xj2 - yj2)) / r3,
                     4.0 * (xj * zj2 - 0.5 * xj * (xj2 - yj2)) / r3,
                     -8.0 * xj * yj * zj / r3);

      Vector3d dwipdu(2.0 * yi * uglyi / idat.rij, -2.0 * xi * uglyi / idat.rij,
                      0.0);

      Vector3d dwjpdu(2.0 * yj * uglyj / idat.rij, -2.0 * xj * uglyj / idat.rij,
                      0.0);

      if (isPower) {
        cerr << "This is probably an error!\n";
        RealType frac1 = 0.25;
        RealType frac2 = 0.75;
        RealType wi2   = wi * wi;
        RealType wj2   = wj * wj;
        // sticky power has no w' function:
        w = frac1 * wi * wi2 + frac2 * wi + frac1 * wj * wj2 + frac2 * wj + v0p;
        wp     = 0.0;
        dwi    = frac1 * RealType(3.0) * wi2 * dwi + frac2 * dwi;
        dwj    = frac1 * RealType(3.0) * wj2 * dwi + frac2 * dwi;
        dwip   = V3Zero;
        dwjp   = V3Zero;
        dwidu  = frac1 * RealType(3.0) * wi2 * dwidu + frac2 * dwidu;
        dwidu  = frac1 * RealType(3.0) * wj2 * dwjdu + frac2 * dwjdu;
        dwipdu = V3Zero;
        dwjpdu = V3Zero;
        sp     = 0.0;
        dspdr  = 0.0;
      }

      idat.vpair += 0.5 * (v0 * s * w + v0p * sp * wp);
      idat.pot[HYDROGENBONDING_FAMILY] +=
          0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;
      if (idat.isSelected)
        idat.selePot[HYDROGENBONDING_FAMILY] +=
            0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;

      // do the torques first since they are easy:
      // remember that these are still in the body-fixed axes

      Vector3d ti = 0.5 * idat.sw * (v0 * s * dwidu + v0p * sp * dwipdu);
      Vector3d tj = 0.5 * idat.sw * (v0 * s * dwjdu + v0p * sp * dwjpdu);

      // go back to lab frame using transpose of rotation matrix:

      idat.t1 += A1trans * ti;
      idat.t2 += A2trans * tj;

      // Now, on to the forces:

      // first rotate the i terms back into the lab frame:

      Vector3d radcomi = (v0 * s * dwi + v0p * sp * dwip) * idat.sw;
      Vector3d radcomj = (v0 * s * dwj + v0p * sp * dwjp) * idat.sw;

      Vector3d fii = A1trans * radcomi;
      Vector3d fjj = A2trans * radcomj;

      // now assemble these with the radial-only terms:

      idat.f1 += 0.5 * ((v0 * dsdr * w + v0p * dspdr * wp) * idat.d / idat.rij +
                        fii - fjj);
    }

    return;
  }